

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch2.hpp
# Opt level: O1

void __thiscall
Catch::ConsoleReporter::testRunEnded(ConsoleReporter *this,TestRunStats *_testRunStats)

{
  ostream *poVar1;
  char cVar2;
  
  printTotalsDivider(this,&_testRunStats->totals);
  printTotals(this,&_testRunStats->totals);
  poVar1 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  cVar2 = (char)poVar1;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  StreamingReporterBase<Catch::ConsoleReporter>::testRunEnded
            (&this->super_StreamingReporterBase<Catch::ConsoleReporter>,_testRunStats);
  return;
}

Assistant:

void ConsoleReporter::testRunEnded(TestRunStats const& _testRunStats) {
    printTotalsDivider(_testRunStats.totals);
    printTotals(_testRunStats.totals);
    stream << std::endl;
    StreamingReporterBase::testRunEnded(_testRunStats);
}